

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::SampledGrid<pbrt::RGB>::SampledGrid
          (SampledGrid<pbrt::RGB> *this,span<const_pbrt::RGB> v,int nx,int ny,int nz,Allocator alloc
          )

{
  int va;
  size_t vb;
  
  vb = (size_t)alloc.memoryResource;
  pstd::vector<pbrt::RGB,pstd::pmr::polymorphic_allocator<pbrt::RGB>>::vector<pbrt::RGB_const*>
            ((vector<pbrt::RGB,pstd::pmr::polymorphic_allocator<pbrt::RGB>> *)this,v.ptr,v.ptr + v.n
             ,(polymorphic_allocator<pbrt::RGB> *)&vb);
  this->nx = nx;
  this->ny = ny;
  this->nz = nz;
  va = ny * nx * nz;
  vb = (this->values).nStored;
  if (vb == (long)va) {
    return;
  }
  LogFatal<char_const(&)[13],char_const(&)[14],char_const(&)[13],int&,char_const(&)[14],unsigned_long&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/containers.h"
             ,0x2de,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])"nx * ny * nz",
             (char (*) [14])"values.size()",(char (*) [13])"nx * ny * nz",&va,
             (char (*) [14])"values.size()",(unsigned_long *)&vb);
}

Assistant:

SampledGrid(pstd::span<const T> v, int nx, int ny, int nz, Allocator alloc)
        : values(v.begin(), v.end(), alloc), nx(nx), ny(ny), nz(nz) {
        CHECK_EQ(nx * ny * nz, values.size());
    }